

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_pad_reflect_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float *y;
  long lVar18;
  int *in_RSI;
  int *in_RDI;
  int i0_1;
  int i0;
  float *right;
  float *left;
  int64_t i1;
  int64_t i2;
  int64_t i3;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  int p1;
  int p0;
  int32_t *opts;
  int nth;
  int ith;
  ggml_tensor *src0;
  int local_e0;
  int local_dc;
  long local_c8;
  long local_c0;
  long local_b8;
  
  piVar5 = *(int **)(in_RSI + 0x26);
  if (*piVar5 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a17,"GGML_ASSERT(%s) failed","src0->type == GGML_TYPE_F32");
  }
  if (*in_RSI != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a18,"GGML_ASSERT(%s) failed","dst->type == GGML_TYPE_F32");
  }
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RSI[0x15];
  iVar4 = in_RSI[0x16];
  uVar6 = *(undefined8 *)(piVar5 + 4);
  lVar7 = *(long *)(piVar5 + 0xe);
  lVar8 = *(long *)(piVar5 + 0x10);
  lVar9 = *(long *)(piVar5 + 0x12);
  lVar10 = *(long *)(in_RSI + 4);
  lVar11 = *(long *)(in_RSI + 6);
  lVar12 = *(long *)(in_RSI + 8);
  lVar13 = *(long *)(in_RSI + 10);
  lVar14 = *(long *)(in_RSI + 0xc);
  lVar15 = *(long *)(in_RSI + 0xe);
  lVar16 = *(long *)(in_RSI + 0x10);
  lVar17 = *(long *)(in_RSI + 0x12);
  for (local_b8 = 0; local_b8 < lVar13; local_b8 = local_b8 + 1) {
    for (local_c0 = 0; local_c0 < lVar12; local_c0 = local_c0 + 1) {
      for (local_c8 = (long)iVar1; local_c8 < lVar11; local_c8 = iVar2 + local_c8) {
        y = (float *)(*(long *)(in_RSI + 0x3e) + local_b8 * lVar17 + local_c0 * lVar16 +
                      local_c8 * lVar15 + iVar3 * lVar14);
        lVar18 = *(long *)(in_RSI + 0x3e) + local_b8 * lVar17 + local_c0 * lVar16 +
                 local_c8 * lVar15 + ((lVar10 - iVar4) + -1) * lVar14;
        ggml_vec_cpy_f32((int)uVar6,y,
                         (float *)(*(long *)(piVar5 + 0x3e) + local_b8 * lVar9 + local_c0 * lVar8 +
                                  local_c8 * lVar7));
        for (local_dc = 1; local_dc <= iVar3; local_dc = local_dc + 1) {
          y[-local_dc] = y[local_dc];
        }
        for (local_e0 = 1; local_e0 <= iVar4; local_e0 = local_e0 + 1) {
          *(undefined4 *)(lVar18 + (long)local_e0 * 4) =
               *(undefined4 *)(lVar18 + (long)-local_e0 * 4);
        }
      }
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pad_reflect_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    const int ith = params->ith;
    const int nth = params->nth;

    const int32_t * opts = (const int32_t *) dst->op_params;
    const int p0 = opts[0];
    const int p1 = opts[1];

    GGML_TENSOR_UNARY_OP_LOCALS

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {
            for (int64_t i1 = ith; i1 < ne1; i1 += nth) {
                float * left  = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 +         p0*nb0);
                float * right = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 + (ne0-p1-1)*nb0);

                ggml_vec_cpy_f32(ne00, left, (float *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01));

                for (int i0 = 1; i0 <= p0; i0++) { left[-i0] = left[i0];   }
                for (int i0 = 1; i0 <= p1; i0++) { right[i0] = right[-i0]; }
            }
        }
    }
}